

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

Sto_Man_t * Sto_ManLoadClauses(char *pFileName)

{
  int iVar1;
  lit lVar2;
  FILE *__stream;
  char *pcVar3;
  lit *local_460;
  lit *plStack_450;
  int RetValue;
  lit *pLits;
  int Number;
  int Counter;
  int nLitsAlloc;
  int nLits;
  char pBuffer [1024];
  Sto_Cls_t *local_30;
  Sto_Cls_t *pClause;
  Sto_Man_t *p;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Error: Cannot open input file (%s).\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Sto_ManAlloc();
    Number = 0x400;
    plStack_450 = (lit *)malloc(0x1000);
    ((Sto_Man_t *)pFileName_local)->nClausesA = 0;
    ((Sto_Man_t *)pFileName_local)->nRoots = 0;
    ((Sto_Man_t *)pFileName_local)->nClauses = 0;
    ((Sto_Man_t *)pFileName_local)->nVars = 0;
    while (pcVar3 = fgets((char *)&nLitsAlloc,0x400,__stream), pcVar3 != (char *)0x0) {
      if ((char)nLitsAlloc != 'c') {
        if ((char)nLitsAlloc == 'p') {
          __isoc99_sscanf((long)&nLitsAlloc + 1,"%d %d %d %d",pFileName_local,
                          &((Sto_Man_t *)pFileName_local)->nClauses,
                          &((Sto_Man_t *)pFileName_local)->nRoots,
                          &((Sto_Man_t *)pFileName_local)->nClausesA);
          break;
        }
        printf("Warning: Skipping line: \"%s\"\n",&nLitsAlloc);
      }
    }
    Counter = 0;
    while (iVar1 = Sto_ManLoadNumber((FILE *)__stream,(int *)&pLits), iVar1 != 0) {
      if ((int)pLits == 0) {
        iVar1 = Sto_ManAddClause((Sto_Man_t *)pFileName_local,plStack_450,plStack_450 + Counter);
        if (iVar1 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satStore.c"
                        ,0x1ae,"Sto_Man_t *Sto_ManLoadClauses(char *)");
        }
        Counter = 0;
      }
      else {
        if (Counter == Number) {
          Number = Number << 1;
          if (plStack_450 == (lit *)0x0) {
            local_460 = (lit *)malloc((long)Number << 2);
          }
          else {
            local_460 = (lit *)realloc(plStack_450,(long)Number << 2);
          }
          plStack_450 = local_460;
        }
        lVar2 = lit_read((int)pLits);
        plStack_450[Counter] = lVar2;
        Counter = Counter + 1;
      }
    }
    if (0 < Counter) {
      printf("Error: The last clause was not saved.\n");
    }
    pLits._4_4_ = 0;
    for (local_30 = ((Sto_Man_t *)pFileName_local)->pHead; local_30 != (Sto_Cls_t *)0x0;
        local_30 = local_30->pNext) {
      pLits._4_4_ = pLits._4_4_ + 1;
    }
    if (((Sto_Man_t *)pFileName_local)->nClauses == pLits._4_4_) {
      if (plStack_450 != (lit *)0x0) {
        free(plStack_450);
      }
      fclose(__stream);
    }
    else {
      printf("Error: The actual number of clauses (%d) is different than declared (%d).\n",
             (ulong)pLits._4_4_,(ulong)(uint)((Sto_Man_t *)pFileName_local)->nClauses);
      Sto_ManFree((Sto_Man_t *)pFileName_local);
      pFileName_local = (char *)0x0;
    }
  }
  return (Sto_Man_t *)pFileName_local;
}

Assistant:

Sto_Man_t * Sto_ManLoadClauses( char * pFileName )
{
    FILE * pFile;
    Sto_Man_t * p;
    Sto_Cls_t * pClause;
    char pBuffer[1024];
    int nLits, nLitsAlloc, Counter, Number;
    lit * pLits;

    // start the file
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Error: Cannot open input file (%s).\n", pFileName );
        return NULL;
    }

    // create the manager
    p = Sto_ManAlloc();

    // alloc the array of literals
    nLitsAlloc = 1024;
    pLits = (lit *)ABC_ALLOC( char, sizeof(lit) * nLitsAlloc );

    // read file header
    p->nVars = p->nClauses = p->nRoots = p->nClausesA = 0;
    while ( fgets( pBuffer, 1024, pFile ) )
    {
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            sscanf( pBuffer + 1, "%d %d %d %d", &p->nVars, &p->nClauses, &p->nRoots, &p->nClausesA );
            break;
        }
        printf( "Warning: Skipping line: \"%s\"\n", pBuffer );
    }

    // read the clauses
    nLits = 0;
    while ( Sto_ManLoadNumber(pFile, &Number) )
    {
        if ( Number == 0 )
        {
            int RetValue;
            RetValue = Sto_ManAddClause( p, pLits, pLits + nLits );
            assert( RetValue );
            nLits = 0;
            continue;
        }
        if ( nLits == nLitsAlloc )
        {
            nLitsAlloc *= 2;
            pLits = ABC_REALLOC( lit, pLits, nLitsAlloc );
        }
        pLits[ nLits++ ] = lit_read(Number);
    }
    if ( nLits > 0 )
        printf( "Error: The last clause was not saved.\n" );

    // count clauses
    Counter = 0;
    Sto_ManForEachClause( p, pClause )
        Counter++;

    // check the number of clauses
    if ( p->nClauses != Counter )
    {
        printf( "Error: The actual number of clauses (%d) is different than declared (%d).\n", Counter, p->nClauses );
        Sto_ManFree( p );
        return NULL;
    }

    ABC_FREE( pLits );
    fclose( pFile );
    return p;
}